

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O3

void __thiscall LCA_InitialDFS_Test::~LCA_InitialDFS_Test(LCA_InitialDFS_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(LCA, InitialDFS) {
    int n = 50;
    rep(tests, 0, 10) {
        generateTree(n);
        function<void(int, int, int)> dfs = [&](int a, int from, int depth) {
            EXPECT_EQ(depth, d[a]);
            EXPECT_EQ(pred[a][0], from);
            for (auto b : g[a]) {
                if (b == from) continue;
                dfs(b, a, depth + 1);
            }
        };
        rep(i, 0, n) {
            initLCA(i, n);
            dfs(i, -1, 0);
        }
    }
}